

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

bool tinyusdz::value::IsLerpSupportedType(uint32_t tyid)

{
  undefined4 uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  value_type *tyname;
  uint32_t in_EDX;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_40 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pv;
  uint32_t underlying_tyid;
  bool has_underlying_tyid;
  uint32_t tyid_local;
  
  pv.contained._31_1_ = 0;
  pv.contained._24_4_ = 0;
  TryGetUnderlyingTypeName_abi_cxx11_(&local_68,(value *)(ulong)tyid,in_EDX);
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40,&local_68);
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_68);
  bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_40);
  if (bVar2) {
    tyname = nonstd::optional_lite::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_40);
    pv.contained._24_4_ = GetTypeId((string *)tyname);
    pv.contained._31_1_ = 1;
  }
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_40);
  uVar3 = TypeTraits<tinyusdz::value::half>::type_id();
  if (tyid == uVar3) {
    has_underlying_tyid = true;
  }
  else {
    uVar3 = TypeTraits<tinyusdz::value::half>::underlying_type_id();
    if (tyid == uVar3) {
      has_underlying_tyid = true;
    }
    else {
      if ((tyid & 0x100000) != 0) {
        uVar3 = TypeTraits<tinyusdz::value::half>::type_id();
        if ((tyid & 0xffefffff) == uVar3) {
          return true;
        }
        uVar3 = TypeTraits<tinyusdz::value::half>::underlying_type_id();
        if ((tyid & 0xffefffff) == uVar3) {
          return true;
        }
      }
      uVar3 = TypeTraits<std::array<tinyusdz::value::half,_2UL>_>::type_id();
      if (tyid == uVar3) {
        has_underlying_tyid = true;
      }
      else {
        uVar3 = TypeTraits<std::array<tinyusdz::value::half,_2UL>_>::underlying_type_id();
        if (tyid == uVar3) {
          has_underlying_tyid = true;
        }
        else {
          if ((tyid & 0x100000) != 0) {
            uVar3 = TypeTraits<std::array<tinyusdz::value::half,_2UL>_>::type_id();
            if ((tyid & 0xffefffff) == uVar3) {
              return true;
            }
            uVar3 = TypeTraits<std::array<tinyusdz::value::half,_2UL>_>::underlying_type_id();
            if ((tyid & 0xffefffff) == uVar3) {
              return true;
            }
          }
          uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
          if (tyid == uVar3) {
            has_underlying_tyid = true;
          }
          else {
            uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::underlying_type_id();
            if (tyid == uVar3) {
              has_underlying_tyid = true;
            }
            else {
              if ((tyid & 0x100000) != 0) {
                uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::type_id();
                if ((tyid & 0xffefffff) == uVar3) {
                  return true;
                }
                uVar3 = TypeTraits<std::array<tinyusdz::value::half,_3UL>_>::underlying_type_id();
                if ((tyid & 0xffefffff) == uVar3) {
                  return true;
                }
              }
              uVar3 = TypeTraits<std::array<tinyusdz::value::half,_4UL>_>::type_id();
              if (tyid == uVar3) {
                has_underlying_tyid = true;
              }
              else {
                uVar3 = TypeTraits<std::array<tinyusdz::value::half,_4UL>_>::underlying_type_id();
                if (tyid == uVar3) {
                  has_underlying_tyid = true;
                }
                else {
                  if ((tyid & 0x100000) != 0) {
                    uVar3 = TypeTraits<std::array<tinyusdz::value::half,_4UL>_>::type_id();
                    if ((tyid & 0xffefffff) == uVar3) {
                      return true;
                    }
                    uVar3 = TypeTraits<std::array<tinyusdz::value::half,_4UL>_>::underlying_type_id
                                      ();
                    if ((tyid & 0xffefffff) == uVar3) {
                      return true;
                    }
                  }
                  uVar3 = TypeTraits<float>::type_id();
                  if (tyid == uVar3) {
                    has_underlying_tyid = true;
                  }
                  else {
                    uVar3 = TypeTraits<float>::underlying_type_id();
                    if (tyid == uVar3) {
                      has_underlying_tyid = true;
                    }
                    else {
                      if ((tyid & 0x100000) != 0) {
                        uVar3 = TypeTraits<float>::type_id();
                        if ((tyid & 0xffefffff) == uVar3) {
                          return true;
                        }
                        uVar3 = TypeTraits<float>::underlying_type_id();
                        if ((tyid & 0xffefffff) == uVar3) {
                          return true;
                        }
                      }
                      uVar3 = TypeTraits<std::array<float,_2UL>_>::type_id();
                      if (tyid == uVar3) {
                        has_underlying_tyid = true;
                      }
                      else {
                        uVar3 = TypeTraits<std::array<float,_2UL>_>::underlying_type_id();
                        if (tyid == uVar3) {
                          has_underlying_tyid = true;
                        }
                        else {
                          if ((tyid & 0x100000) != 0) {
                            uVar3 = TypeTraits<std::array<float,_2UL>_>::type_id();
                            if ((tyid & 0xffefffff) == uVar3) {
                              return true;
                            }
                            uVar3 = TypeTraits<std::array<float,_2UL>_>::underlying_type_id();
                            if ((tyid & 0xffefffff) == uVar3) {
                              return true;
                            }
                          }
                          uVar3 = TypeTraits<std::array<float,_3UL>_>::type_id();
                          if (tyid == uVar3) {
                            has_underlying_tyid = true;
                          }
                          else {
                            uVar3 = TypeTraits<std::array<float,_3UL>_>::underlying_type_id();
                            if (tyid == uVar3) {
                              has_underlying_tyid = true;
                            }
                            else {
                              if ((tyid & 0x100000) != 0) {
                                uVar3 = TypeTraits<std::array<float,_3UL>_>::type_id();
                                if ((tyid & 0xffefffff) == uVar3) {
                                  return true;
                                }
                                uVar3 = TypeTraits<std::array<float,_3UL>_>::underlying_type_id();
                                if ((tyid & 0xffefffff) == uVar3) {
                                  return true;
                                }
                              }
                              uVar3 = TypeTraits<std::array<float,_4UL>_>::type_id();
                              if (tyid == uVar3) {
                                has_underlying_tyid = true;
                              }
                              else {
                                uVar3 = TypeTraits<std::array<float,_4UL>_>::underlying_type_id();
                                if (tyid == uVar3) {
                                  has_underlying_tyid = true;
                                }
                                else {
                                  if ((tyid & 0x100000) != 0) {
                                    uVar3 = TypeTraits<std::array<float,_4UL>_>::type_id();
                                    if ((tyid & 0xffefffff) == uVar3) {
                                      return true;
                                    }
                                    uVar3 = TypeTraits<std::array<float,_4UL>_>::underlying_type_id
                                                      ();
                                    if ((tyid & 0xffefffff) == uVar3) {
                                      return true;
                                    }
                                  }
                                  uVar3 = TypeTraits<double>::type_id();
                                  if (tyid == uVar3) {
                                    has_underlying_tyid = true;
                                  }
                                  else {
                                    uVar3 = TypeTraits<double>::underlying_type_id();
                                    if (tyid == uVar3) {
                                      has_underlying_tyid = true;
                                    }
                                    else {
                                      if ((tyid & 0x100000) != 0) {
                                        uVar3 = TypeTraits<double>::type_id();
                                        if ((tyid & 0xffefffff) == uVar3) {
                                          return true;
                                        }
                                        uVar3 = TypeTraits<double>::underlying_type_id();
                                        if ((tyid & 0xffefffff) == uVar3) {
                                          return true;
                                        }
                                      }
                                      uVar3 = TypeTraits<std::array<double,_2UL>_>::type_id();
                                      if (tyid == uVar3) {
                                        has_underlying_tyid = true;
                                      }
                                      else {
                                        uVar3 = TypeTraits<std::array<double,_2UL>_>::
                                                underlying_type_id();
                                        if (tyid == uVar3) {
                                          has_underlying_tyid = true;
                                        }
                                        else {
                                          if ((tyid & 0x100000) != 0) {
                                            uVar3 = TypeTraits<std::array<double,_2UL>_>::type_id();
                                            if ((tyid & 0xffefffff) == uVar3) {
                                              return true;
                                            }
                                            uVar3 = TypeTraits<std::array<double,_2UL>_>::
                                                    underlying_type_id();
                                            if ((tyid & 0xffefffff) == uVar3) {
                                              return true;
                                            }
                                          }
                                          uVar3 = TypeTraits<std::array<double,_3UL>_>::type_id();
                                          if (tyid == uVar3) {
                                            has_underlying_tyid = true;
                                          }
                                          else {
                                            uVar3 = TypeTraits<std::array<double,_3UL>_>::
                                                    underlying_type_id();
                                            if (tyid == uVar3) {
                                              has_underlying_tyid = true;
                                            }
                                            else {
                                              if ((tyid & 0x100000) != 0) {
                                                uVar3 = TypeTraits<std::array<double,_3UL>_>::
                                                        type_id();
                                                if ((tyid & 0xffefffff) == uVar3) {
                                                  return true;
                                                }
                                                uVar3 = TypeTraits<std::array<double,_3UL>_>::
                                                        underlying_type_id();
                                                if ((tyid & 0xffefffff) == uVar3) {
                                                  return true;
                                                }
                                              }
                                              uVar3 = TypeTraits<std::array<double,_4UL>_>::type_id
                                                                ();
                                              if (tyid == uVar3) {
                                                has_underlying_tyid = true;
                                              }
                                              else {
                                                uVar3 = TypeTraits<std::array<double,_4UL>_>::
                                                        underlying_type_id();
                                                if (tyid == uVar3) {
                                                  has_underlying_tyid = true;
                                                }
                                                else {
                                                  if ((tyid & 0x100000) != 0) {
                                                    uVar3 = TypeTraits<std::array<double,_4UL>_>::
                                                            type_id();
                                                    if ((tyid & 0xffefffff) == uVar3) {
                                                      return true;
                                                    }
                                                    uVar3 = TypeTraits<std::array<double,_4UL>_>::
                                                            underlying_type_id();
                                                    if ((tyid & 0xffefffff) == uVar3) {
                                                      return true;
                                                    }
                                                  }
                                                  uVar3 = TypeTraits<tinyusdz::value::quath>::
                                                          type_id();
                                                  if (tyid == uVar3) {
                                                    has_underlying_tyid = true;
                                                  }
                                                  else {
                                                    uVar3 = TypeTraits<tinyusdz::value::quath>::
                                                            underlying_type_id();
                                                    if (tyid == uVar3) {
                                                      has_underlying_tyid = true;
                                                    }
                                                    else {
                                                      if ((tyid & 0x100000) != 0) {
                                                        uVar3 = TypeTraits<tinyusdz::value::quath>::
                                                                type_id();
                                                        if ((tyid & 0xffefffff) == uVar3) {
                                                          return true;
                                                        }
                                                        uVar3 = TypeTraits<tinyusdz::value::quath>::
                                                                underlying_type_id();
                                                        if ((tyid & 0xffefffff) == uVar3) {
                                                          return true;
                                                        }
                                                      }
                                                      uVar3 = TypeTraits<tinyusdz::value::quatf>::
                                                              type_id();
                                                      if (tyid == uVar3) {
                                                        has_underlying_tyid = true;
                                                      }
                                                      else {
                                                        uVar3 = TypeTraits<tinyusdz::value::quatf>::
                                                                underlying_type_id();
                                                        if (tyid == uVar3) {
                                                          has_underlying_tyid = true;
                                                        }
                                                        else {
                                                          if ((tyid & 0x100000) != 0) {
                                                            uVar3 = 
                                                  TypeTraits<tinyusdz::value::quatf>::type_id();
                                                  if ((tyid & 0xffefffff) == uVar3) {
                                                    return true;
                                                  }
                                                  uVar3 = TypeTraits<tinyusdz::value::quatf>::
                                                          underlying_type_id();
                                                  if ((tyid & 0xffefffff) == uVar3) {
                                                    return true;
                                                  }
                                                  }
                                                  uVar3 = TypeTraits<tinyusdz::value::quatd>::
                                                          type_id();
                                                  if (tyid == uVar3) {
                                                    has_underlying_tyid = true;
                                                  }
                                                  else {
                                                    uVar3 = TypeTraits<tinyusdz::value::quatd>::
                                                            underlying_type_id();
                                                    if (tyid == uVar3) {
                                                      has_underlying_tyid = true;
                                                    }
                                                    else {
                                                      if ((tyid & 0x100000) != 0) {
                                                        uVar3 = TypeTraits<tinyusdz::value::quatd>::
                                                                type_id();
                                                        if ((tyid & 0xffefffff) == uVar3) {
                                                          return true;
                                                        }
                                                        uVar3 = TypeTraits<tinyusdz::value::quatd>::
                                                                underlying_type_id();
                                                        if ((tyid & 0xffefffff) == uVar3) {
                                                          return true;
                                                        }
                                                      }
                                                      uVar3 = TypeTraits<tinyusdz::value::matrix2d>
                                                              ::type_id();
                                                      if (tyid == uVar3) {
                                                        has_underlying_tyid = true;
                                                      }
                                                      else {
                                                        uVar3 = 
                                                  TypeTraits<tinyusdz::value::matrix2d>::
                                                  underlying_type_id();
                                                  if (tyid == uVar3) {
                                                    has_underlying_tyid = true;
                                                  }
                                                  else {
                                                    if ((tyid & 0x100000) != 0) {
                                                      uVar3 = TypeTraits<tinyusdz::value::matrix2d>
                                                              ::type_id();
                                                      if ((tyid & 0xffefffff) == uVar3) {
                                                        return true;
                                                      }
                                                      uVar3 = TypeTraits<tinyusdz::value::matrix2d>
                                                              ::underlying_type_id();
                                                      if ((tyid & 0xffefffff) == uVar3) {
                                                        return true;
                                                      }
                                                    }
                                                    uVar3 = TypeTraits<tinyusdz::value::matrix3d>::
                                                            type_id();
                                                    if (tyid == uVar3) {
                                                      has_underlying_tyid = true;
                                                    }
                                                    else {
                                                      uVar3 = TypeTraits<tinyusdz::value::matrix3d>
                                                              ::underlying_type_id();
                                                      if (tyid == uVar3) {
                                                        has_underlying_tyid = true;
                                                      }
                                                      else {
                                                        if ((tyid & 0x100000) != 0) {
                                                          uVar3 = 
                                                  TypeTraits<tinyusdz::value::matrix3d>::type_id();
                                                  if ((tyid & 0xffefffff) == uVar3) {
                                                    return true;
                                                  }
                                                  uVar3 = TypeTraits<tinyusdz::value::matrix3d>::
                                                          underlying_type_id();
                                                  if ((tyid & 0xffefffff) == uVar3) {
                                                    return true;
                                                  }
                                                  }
                                                  uVar3 = TypeTraits<tinyusdz::value::matrix4d>::
                                                          type_id();
                                                  if (tyid == uVar3) {
                                                    has_underlying_tyid = true;
                                                  }
                                                  else {
                                                    uVar3 = TypeTraits<tinyusdz::value::matrix4d>::
                                                            underlying_type_id();
                                                    if (tyid == uVar3) {
                                                      has_underlying_tyid = true;
                                                    }
                                                    else {
                                                      if ((tyid & 0x100000) != 0) {
                                                        uVar3 = 
                                                  TypeTraits<tinyusdz::value::matrix4d>::type_id();
                                                  if ((tyid & 0xffefffff) == uVar3) {
                                                    return true;
                                                  }
                                                  uVar3 = TypeTraits<tinyusdz::value::matrix4d>::
                                                          underlying_type_id();
                                                  if ((tyid & 0xffefffff) == uVar3) {
                                                    return true;
                                                  }
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  if ((pv.contained._31_1_ & 1) != 0) {
                                                    uVar3 = TypeTraits<tinyusdz::value::half>::
                                                            type_id();
                                                    if (uVar1 == uVar3) {
                                                      return true;
                                                    }
                                                    if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                       (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                       uVar3 = TypeTraits<tinyusdz::value::half>::
                                                               type_id(), uVar4 == uVar3)) {
                                                      return true;
                                                    }
                                                    uVar1 = pv.contained._24_4_;
                                                    uVar3 = 
                                                  TypeTraits<std::array<tinyusdz::value::half,_2UL>_>
                                                  ::type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = 
                                                  TypeTraits<std::array<tinyusdz::value::half,_2UL>_>
                                                  ::type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = 
                                                  TypeTraits<std::array<tinyusdz::value::half,_3UL>_>
                                                  ::type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = 
                                                  TypeTraits<std::array<tinyusdz::value::half,_3UL>_>
                                                  ::type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = 
                                                  TypeTraits<std::array<tinyusdz::value::half,_4UL>_>
                                                  ::type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = 
                                                  TypeTraits<std::array<tinyusdz::value::half,_4UL>_>
                                                  ::type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<float>::type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<float>::type_id(),
                                                     uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<std::array<float,_2UL>_>::
                                                          type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<std::array<float,_2UL>_>::
                                                             type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<std::array<float,_3UL>_>::
                                                          type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<std::array<float,_3UL>_>::
                                                             type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<std::array<float,_4UL>_>::
                                                          type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<std::array<float,_4UL>_>::
                                                             type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<double>::type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<double>::type_id(),
                                                     uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<std::array<double,_2UL>_>::
                                                          type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<std::array<double,_2UL>_>::
                                                             type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<std::array<double,_3UL>_>::
                                                          type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<std::array<double,_3UL>_>::
                                                             type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<std::array<double,_4UL>_>::
                                                          type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<std::array<double,_4UL>_>::
                                                             type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<tinyusdz::value::quath>::
                                                          type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<tinyusdz::value::quath>::
                                                             type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<tinyusdz::value::quatf>::
                                                          type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<tinyusdz::value::quatf>::
                                                             type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<tinyusdz::value::quatd>::
                                                          type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<tinyusdz::value::quatd>::
                                                             type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<tinyusdz::value::matrix2d>::
                                                          type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<tinyusdz::value::matrix2d>::
                                                             type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<tinyusdz::value::matrix3d>::
                                                          type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<tinyusdz::value::matrix3d>::
                                                             type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  uVar1 = pv.contained._24_4_;
                                                  uVar3 = TypeTraits<tinyusdz::value::matrix4d>::
                                                          type_id();
                                                  if (uVar1 == uVar3) {
                                                    return true;
                                                  }
                                                  if (((pv.contained._24_4_ & 0x100000) != 0) &&
                                                     (uVar4 = pv.contained._24_4_ & 0xffefffff,
                                                     uVar3 = TypeTraits<tinyusdz::value::matrix4d>::
                                                             type_id(), uVar4 == uVar3)) {
                                                    return true;
                                                  }
                                                  }
                                                  has_underlying_tyid = false;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return has_underlying_tyid;
}

Assistant:

bool IsLerpSupportedType(uint32_t tyid) {

  // TODO: Directly get underlying_typeid
  bool has_underlying_tyid{false};
  uint32_t underlying_tyid{TYPE_ID_INVALID};

  if (auto pv = TryGetUnderlyingTypeName(tyid)) {
    underlying_tyid = GetTypeId(pv.value());
    has_underlying_tyid = true;
  } 

  // See also for underlying_type_id to simplify check for Role types(e.g. color3f)
#define IS_SUPPORTED_TYPE(__tyid, __ty) \
  if (__tyid == value::TypeTraits<__ty>::type_id()) { \
    return true; \
  } else if (__tyid == value::TypeTraits<__ty>::underlying_type_id()) { \
    return true; \
  } else if (__tyid & value::TYPE_ID_1D_ARRAY_BIT) { \
    if ((__tyid & (~value::TYPE_ID_1D_ARRAY_BIT)) == (value::TypeTraits<__ty>::type_id())) { \
      return true; \
    } else if ((__tyid & (~value::TYPE_ID_1D_ARRAY_BIT)) == (value::TypeTraits<__ty>::underlying_type_id())) { \
      return true; \
    } \
  }

  // Assume __uty is underlying_type.
#define IS_SUPPORTED_UNDERLYING_TYPE(__utyid, __uty) \
  if (__utyid == value::TypeTraits<__uty>::type_id()) { \
    return true; \
  } else if (__utyid & value::TYPE_ID_1D_ARRAY_BIT) { \
    if ((__utyid & (~value::TYPE_ID_1D_ARRAY_BIT)) == (value::TypeTraits<__uty>::type_id())) { \
      return true; \
    } \
  }

  IS_SUPPORTED_TYPE(tyid, value::half)
  IS_SUPPORTED_TYPE(tyid, value::half2)
  IS_SUPPORTED_TYPE(tyid, value::half3)
  IS_SUPPORTED_TYPE(tyid, value::half4)
  IS_SUPPORTED_TYPE(tyid, float)
  IS_SUPPORTED_TYPE(tyid, value::float2)
  IS_SUPPORTED_TYPE(tyid, value::float3)
  IS_SUPPORTED_TYPE(tyid, value::float4)
  IS_SUPPORTED_TYPE(tyid, double)
  IS_SUPPORTED_TYPE(tyid, value::double2)
  IS_SUPPORTED_TYPE(tyid, value::double3)
  IS_SUPPORTED_TYPE(tyid, value::double4)
  IS_SUPPORTED_TYPE(tyid, value::quath)
  IS_SUPPORTED_TYPE(tyid, value::quatf)
  IS_SUPPORTED_TYPE(tyid, value::quatd)
  IS_SUPPORTED_TYPE(tyid, value::matrix2d)
  IS_SUPPORTED_TYPE(tyid, value::matrix3d)
  IS_SUPPORTED_TYPE(tyid, value::matrix4d)

  if (has_underlying_tyid) {
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half2)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half3)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::half4)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, float)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::float2)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::float3)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::float4)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, double)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::double2)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::double3)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::double4)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::quath)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::quatf)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::quatd)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::matrix2d)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::matrix3d)
    IS_SUPPORTED_UNDERLYING_TYPE(underlying_tyid, value::matrix4d)
  }

#undef IS_SUPPORTED_TYPE
#undef IS_SUPPORTED_UNDERLYING_TYPE

  return false;

}